

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,DefinitionSymbol *args,
          SourceRange *args_1)

{
  iterator this_00;
  SourceRange *in_RDX;
  DefinitionSymbol *in_RSI;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *in_RDI;
  DefinitionSymbol *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
                        (in_stack_00000040,in_stack_00000038,in_stack_00000030,(SourceRange *)this);
  }
  else {
    this_00 = end(in_RDI);
    ast::ConfigBlockSymbol::TopCell::TopCell(this_00,in_RSI,*in_RDX);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }